

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_indirect_sort(uint64_t *freq,uint64_t *syms,uint64_t *a,uint64_t n)

{
  undefined8 uVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint64_t *puVar12;
  
  if (6 < n) {
    do {
      puVar3 = a + (n >> 1);
      if (n != 7) {
        puVar4 = a + (n - 1);
        puVar2 = a;
        if (0x28 < n) {
          uVar6 = n & 0xfffffffffffffff8;
          puVar2 = shuff_med3(a,(uint64_t *)((long)a + uVar6),a + (n >> 3) * 2,freq);
          puVar3 = shuff_med3((uint64_t *)((long)puVar3 - uVar6),puVar3,
                              (uint64_t *)((long)puVar3 + uVar6),freq);
          puVar4 = shuff_med3(puVar4 + (n >> 3) * -2,(uint64_t *)((long)puVar4 - uVar6),puVar4,freq)
          ;
        }
        puVar3 = shuff_med3(puVar2,puVar3,puVar4,freq);
      }
      uVar7 = *a;
      puVar4 = a + (n - 1);
      *a = *puVar3;
      *puVar3 = uVar7;
      puVar3 = a + 1;
      puVar2 = puVar3;
      puVar12 = puVar4;
LAB_0011ff4b:
      for (; puVar3 <= puVar4; puVar3 = puVar3 + 1) {
        uVar7 = freq[*puVar3];
        uVar5 = freq[*a];
        if (uVar7 != uVar5 && -1 < (long)(uVar7 - uVar5)) break;
        if (uVar7 == uVar5) {
          uVar7 = *puVar2;
          *puVar2 = *puVar3;
          puVar2 = puVar2 + 1;
          *puVar3 = uVar7;
        }
      }
LAB_0011ff94:
      if (puVar3 <= puVar4) {
        uVar7 = *puVar4;
        if (-1 < (long)(freq[uVar7] - freq[*a])) goto LAB_0011ff81;
        uVar5 = *puVar3;
        *puVar3 = uVar7;
        puVar3 = puVar3 + 1;
        *puVar4 = uVar5;
        puVar4 = puVar4 + -1;
        goto LAB_0011ff4b;
      }
      uVar7 = (long)puVar2 - (long)a >> 3;
      uVar5 = (long)puVar3 - (long)puVar2 >> 3;
      if ((long)uVar5 <= (long)uVar7) {
        uVar7 = uVar5;
      }
      if (0 < (long)uVar7) {
        uVar6 = uVar7 + 1;
        lVar10 = 0;
        do {
          uVar1 = *(undefined8 *)((long)a + lVar10);
          uVar6 = uVar6 - 1;
          *(undefined8 *)((long)a + lVar10) = *(undefined8 *)((long)puVar3 + lVar10 + uVar7 * -8);
          *(undefined8 *)((long)puVar3 + lVar10 + uVar7 * -8) = uVar1;
          lVar10 = lVar10 + 8;
        } while (1 < uVar6);
      }
      uVar11 = (long)puVar12 - (long)puVar4 >> 3;
      uVar6 = ((long)((long)a + (n * 8 - (long)puVar12)) >> 3) - 1;
      if ((long)uVar11 < (long)uVar6) {
        uVar6 = uVar11;
      }
      if (0 < (long)uVar6) {
        uVar8 = uVar6 + 1;
        lVar10 = uVar6 * -8 + n * 8;
        lVar9 = 0;
        do {
          uVar1 = *(undefined8 *)((long)puVar3 + lVar9);
          uVar8 = uVar8 - 1;
          *(undefined8 *)((long)puVar3 + lVar9) = *(undefined8 *)((long)a + lVar9 + lVar10);
          *(undefined8 *)((long)a + lVar9 + lVar10) = uVar1;
          lVar9 = lVar9 + 8;
        } while (1 < uVar8);
      }
      if (1 < (long)uVar5) {
        shuff_indirect_sort(freq,syms,a,uVar5);
      }
      if ((long)uVar11 < 2) {
        return;
      }
      a = a + (n - uVar11);
      n = uVar11;
      if (uVar11 < 7) {
        puVar3 = (uint64_t *)(((long)puVar12 - (long)puVar4) + (long)a);
        goto LAB_00120095;
      }
    } while( true );
  }
  if (1 < n) {
    puVar3 = a + n;
LAB_00120095:
    puVar4 = a + 1;
    do {
      if (a < puVar4) {
        uVar7 = *puVar4;
        puVar2 = puVar4;
        do {
          if (freq[puVar2[-1]] == freq[uVar7] || (long)(freq[puVar2[-1]] - freq[uVar7]) < 0) break;
          puVar12 = puVar2 + -1;
          *puVar2 = puVar2[-1];
          puVar2[-1] = uVar7;
          puVar2 = puVar12;
        } while (a < puVar12);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 < puVar3);
  }
  return;
LAB_0011ff81:
  if (freq[uVar7] == freq[*a]) {
    *puVar4 = *puVar12;
    *puVar12 = uVar7;
    puVar12 = puVar12 + -1;
  }
  puVar4 = puVar4 + -1;
  goto LAB_0011ff94;
}

Assistant:

void shuff_indirect_sort(
    uint64_t* freq, uint64_t* syms, uint64_t* a, uint64_t n)
{
    uint64_t *pa, *pb, *pc, *pd, *pl, *pm, *pn;
    int64_t d, r;
    const int64_t es = 1;

    if (n < 7) {
        for (pm = a + es; pm < a + n * es; pm += es)
            for (pl = pm; pl > a && shuff_cmp(pl - es, pl, freq) > 0; pl -= es)
                shuff_swap(pl, pl - es);
        return;
    }
    pm = a + (n / 2) * es;
    if (n > 7) {
        pl = a;
        pn = a + (n - 1) * es;
        if (n > 40) {
            d = (n / 8) * es;
            pl = shuff_med3(pl, pl + d, pl + 2 * d, freq);
            pm = shuff_med3(pm - d, pm, pm + d, freq);
            pn = shuff_med3(pn - 2 * d, pn - d, pn, freq);
        }
        pm = shuff_med3(pl, pm, pn, freq);
    }
    shuff_swap(a, pm);
    pa = pb = a + es;

    pc = pd = a + (n - 1) * es;
    for (;;) {
        while (pb <= pc && (r = shuff_cmp(pb, a, freq)) <= 0) {
            if (r == 0) {
                shuff_swap(pa, pb);
                pa += es;
            }
            pb += es;
        }
        while (pb <= pc && (r = shuff_cmp(pc, a, freq)) >= 0) {
            if (r == 0) {
                shuff_swap(pc, pd);
                pd -= es;
            }
            pc -= es;
        }
        if (pb > pc)
            break;
        shuff_swap(pb, pc);
        pb += es;
        pc -= es;
    }
    pn = a + n * es;
    r = shuff_min(pa - a, pb - pa);
    vecshuff_swap(a, pb - r, r);
    r = shuff_min(pd - pc, pn - pd - es);
    vecshuff_swap(pb, pn - r, r);
    if ((r = pb - pa) > es)
        shuff_indirect_sort(freq, syms, a, r / es);
    if ((r = pd - pc) > es)
        shuff_indirect_sort(freq, syms, pn - r, r / es);
}